

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_1::RobustnessTestCase::~RobustnessTestCase(RobustnessTestCase *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RobustnessTestCase_01e0b2b8;
  deinit(this);
  Params::~Params(&this->m_params);
  egl::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

RobustnessTestCase::~RobustnessTestCase (void)
{
	deinit();
}